

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg-queue.c
# Opt level: O1

_Bool ndn_msgqueue_empty(void)

{
  ndn_msg_t *pnVar1;
  ndn_msg_t *pnVar2;
  uint8_t *puVar3;
  
  pnVar1 = ptail;
  puVar3 = (uint8_t *)pfront;
  if (pfront != ptail && pfront->func == (ndn_msg_callback)0xffffffffffffffff) {
    do {
      puVar3 = (uint8_t *)((long)&((ndn_msg_t *)puVar3)->obj + ((ndn_msg_t *)puVar3)->length);
      if ((ndn_msg_t *)(msg_queue + 0xfff) < puVar3) {
        puVar3 = msg_queue;
      }
      pfront = (ndn_msg_t *)puVar3;
    } while ((((ndn_msg_t *)puVar3)->func == (ndn_msg_callback)0xffffffffffffffff) &&
            ((ndn_msg_t *)puVar3 != ptail));
  }
  pnVar2 = pfront;
  if (pfront == ptail) {
    psplit = (ndn_msg_t *)msg_queue;
    ptail = (ndn_msg_t *)msg_queue;
    pfront = (ndn_msg_t *)msg_queue;
  }
  return pnVar2 == pnVar1;
}

Assistant:

bool
ndn_msgqueue_empty(void) {
  while(pfront->func == NDN_MSG_PADDING && pfront != ptail){
    MSGQUEUE_NEXT(pfront);
  }
  if(pfront == ptail){
    // defrag when empty
    pfront = ptail = psplit = (ndn_msg_t*)&msg_queue[0];
    return true;
  } else
    return false;
}